

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmJsonObjects.cxx
# Opt level: O0

Value * DumpCTestInfo(Value *__return_storage_ptr__,cmLocalGenerator *lg,cmTest *testInfo,
                     string *config)

{
  cmTest *pcVar1;
  bool bVar2;
  Value *pVVar3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this;
  pointer pcVar4;
  string *psVar5;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
  *this_00;
  Value local_258;
  Value local_230;
  string local_208;
  string *local_1e8;
  string *processed_value;
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
  cge_value;
  undefined1 local_1b0 [8];
  Value entry;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>
  *prop;
  iterator __end1_1;
  iterator __begin1_1;
  cmPropertyMap *__range1_1;
  Value properties;
  string local_118;
  string *local_f8;
  string *processed;
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_> cge
  ;
  undefined1 local_d8 [8];
  cmGeneratorExpression ge;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *cmd;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  string command;
  string local_78;
  Value local_58;
  byte local_29;
  string *local_28;
  string *config_local;
  cmTest *testInfo_local;
  cmLocalGenerator *lg_local;
  Value *result;
  
  local_29 = 0;
  local_28 = config;
  config_local = (string *)testInfo;
  testInfo_local = (cmTest *)lg;
  lg_local = (cmLocalGenerator *)__return_storage_ptr__;
  Json::Value::Value(__return_storage_ptr__,objectValue);
  cmTest::GetName_abi_cxx11_(&local_78,(cmTest *)config_local);
  Json::Value::Value(&local_58,&local_78);
  pVVar3 = Json::Value::operator[](__return_storage_ptr__,&kCTEST_NAME_abi_cxx11_);
  Json::Value::operator=(pVVar3,&local_58);
  Json::Value::~Value(&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::string((string *)&__range1);
  this = cmTest::GetCommand_abi_cxx11_((cmTest *)config_local);
  __end1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(this);
  cmd = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::end(this);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)&cmd);
    if (!bVar2) break;
    ge.Backtrace.TopEntry.
    super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
            __gnu_cxx::
            __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator*(&__end1);
    std::__cxx11::string::append((string *)&__range1);
    std::__cxx11::string::append((char *)&__range1);
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1);
  }
  cge._M_t.
  super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
  ._M_t.
  super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
  .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>._M_head_impl =
       (__uniq_ptr_data<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>,_true,_true>
        )(__uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
          )0x0;
  cmListFileBacktrace::cmListFileBacktrace((cmListFileBacktrace *)&cge);
  cmGeneratorExpression::cmGeneratorExpression
            ((cmGeneratorExpression *)local_d8,(cmListFileBacktrace *)&cge);
  cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)&cge);
  cmGeneratorExpression::Parse((cmGeneratorExpression *)&processed,(string *)local_d8);
  pcVar4 = std::
           unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
           ::operator->((unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                         *)&processed);
  pcVar1 = testInfo_local;
  psVar5 = local_28;
  std::__cxx11::string::string((string *)&local_118);
  psVar5 = cmCompiledGeneratorExpression::Evaluate
                     (pcVar4,(cmLocalGenerator *)pcVar1,psVar5,false,(cmGeneratorTarget *)0x0,
                      (cmGeneratorTarget *)0x0,(cmGeneratorExpressionDAGChecker *)0x0,&local_118);
  std::__cxx11::string::~string((string *)&local_118);
  local_f8 = psVar5;
  Json::Value::Value((Value *)&properties.limit_,psVar5);
  pVVar3 = Json::Value::operator[](__return_storage_ptr__,&kCTEST_COMMAND_abi_cxx11_);
  Json::Value::operator=(pVVar3,(Value *)&properties.limit_);
  Json::Value::~Value((Value *)&properties.limit_);
  Json::Value::Value((Value *)&__range1_1,arrayValue);
  this_00 = &cmTest::GetProperties((cmTest *)config_local)->
             super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
  ;
  __end1_1 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
             ::begin(this_00);
  prop = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>
          *)std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
            ::end(this_00);
  while( true ) {
    bVar2 = std::operator!=(&__end1_1,(_Self *)&prop);
    if (!bVar2) break;
    entry.limit_ = (ptrdiff_t)
                   std::
                   _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>
                   ::operator*(&__end1_1);
    Json::Value::Value((Value *)local_1b0,objectValue);
    Json::Value::Value((Value *)&cge_value,(string *)entry.limit_);
    pVVar3 = Json::Value::operator[]((Value *)local_1b0,&kKEY_KEY_abi_cxx11_);
    Json::Value::operator=(pVVar3,(Value *)&cge_value);
    Json::Value::~Value((Value *)&cge_value);
    cmProperty::GetValue((cmProperty *)(entry.limit_ + 0x20));
    cmGeneratorExpression::Parse((cmGeneratorExpression *)&processed_value,local_d8);
    pcVar4 = std::
             unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
             ::operator->((unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                           *)&processed_value);
    pcVar1 = testInfo_local;
    psVar5 = local_28;
    std::__cxx11::string::string((string *)&local_208);
    psVar5 = cmCompiledGeneratorExpression::Evaluate
                       (pcVar4,(cmLocalGenerator *)pcVar1,psVar5,false,(cmGeneratorTarget *)0x0,
                        (cmGeneratorTarget *)0x0,(cmGeneratorExpressionDAGChecker *)0x0,&local_208);
    std::__cxx11::string::~string((string *)&local_208);
    local_1e8 = psVar5;
    Json::Value::Value(&local_230,psVar5);
    pVVar3 = Json::Value::operator[]((Value *)local_1b0,&kVALUE_KEY_abi_cxx11_);
    Json::Value::operator=(pVVar3,&local_230);
    Json::Value::~Value(&local_230);
    Json::Value::append((Value *)&__range1_1,(Value *)local_1b0);
    std::
    unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>::
    ~unique_ptr((unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                 *)&processed_value);
    Json::Value::~Value((Value *)local_1b0);
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>
    ::operator++(&__end1_1);
  }
  Json::Value::Value(&local_258,(Value *)&__range1_1);
  pVVar3 = Json::Value::operator[](__return_storage_ptr__,&kPROPERTIES_KEY_abi_cxx11_);
  Json::Value::operator=(pVVar3,&local_258);
  Json::Value::~Value(&local_258);
  local_29 = 1;
  Json::Value::~Value((Value *)&__range1_1);
  std::
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>::
  ~unique_ptr((unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
               *)&processed);
  cmGeneratorExpression::~cmGeneratorExpression((cmGeneratorExpression *)local_d8);
  std::__cxx11::string::~string((string *)&__range1);
  if ((local_29 & 1) == 0) {
    Json::Value::~Value(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

static Json::Value DumpCTestInfo(cmLocalGenerator* lg, cmTest* testInfo,
                                 const std::string& config)
{
  Json::Value result = Json::objectValue;
  result[kCTEST_NAME] = testInfo->GetName();

  // Concat command entries together. After the first should be the arguments
  // for the command
  std::string command;
  for (auto const& cmd : testInfo->GetCommand()) {
    command.append(cmd);
    command.append(" ");
  }

  // Remove any config specific variables from the output.
  cmGeneratorExpression ge;
  auto cge = ge.Parse(command);
  const std::string& processed = cge->Evaluate(lg, config);
  result[kCTEST_COMMAND] = processed;

  // Build up the list of properties that may have been specified
  Json::Value properties = Json::arrayValue;
  for (auto& prop : testInfo->GetProperties()) {
    Json::Value entry = Json::objectValue;
    entry[kKEY_KEY] = prop.first;

    // Remove config variables from the value too.
    auto cge_value = ge.Parse(prop.second.GetValue());
    const std::string& processed_value = cge_value->Evaluate(lg, config);
    entry[kVALUE_KEY] = processed_value;
    properties.append(entry);
  }
  result[kPROPERTIES_KEY] = properties;

  return result;
}